

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O3

int get_branchlength(uint32_t **pptrptr,int *errcodeptr,int *lcptr,parsed_recurse_check *recurses,
                    compile_block_16 *cb)

{
  parsed_recurse_check *ppVar1;
  ushort uVar2;
  int iVar3;
  BOOL BVar4;
  int iVar5;
  uint32_t *puVar6;
  uint32_t *puVar7;
  uint uVar8;
  uint32_t uVar9;
  int iVar10;
  uint16_t *puVar11;
  int iVar12;
  PCRE2_SPTR16 str1;
  uint uVar13;
  uint32_t uVar14;
  uint uVar15;
  parsed_recurse_check this_recurse;
  uint32_t *local_80;
  size_t local_78;
  compile_block_16 *local_70;
  parsed_recurse_check *local_68;
  int *local_60;
  int *local_58;
  uint32_t *local_50;
  uint32_t **local_48;
  parsed_recurse_check local_40;
  
  puVar7 = *pptrptr;
  iVar3 = *lcptr;
  *lcptr = iVar3 + 1;
  if (2000 < iVar3) {
    *errcodeptr = 0x87;
    return -1;
  }
  iVar3 = 0;
  iVar12 = 0;
  local_68 = recurses;
  local_58 = lcptr;
  local_48 = pptrptr;
LAB_00143ac6:
  uVar8 = *puVar7;
  local_80 = puVar7;
  if (-1 < (int)uVar8) goto switchD_00143b1a_caseD_b;
  uVar15 = 0;
  iVar5 = 0;
  switch(uVar8 + 0x7fff0000 >> 0x10) {
  case 0:
  case 0x18:
    goto switchD_00143b1a_caseD_0;
  case 2:
    if (((cb->external_options & 0x200) != 0) || ((cb->external_flags & 0x200000) != 0))
    goto switchD_00143b1a_caseD_a;
    uVar14 = uVar8 & 0xffff;
    if (9 < uVar14) goto LAB_00143d51;
    local_78 = cb->small_ref_offset[uVar14];
    goto LAB_00143d6c;
  case 3:
    if ((cb->external_options & 0x200) != 0) goto switchD_00143b1a_caseD_a;
  case 0x20:
    uVar15 = puVar7[1];
    local_80 = puVar7 + 3;
    local_78 = CONCAT44(puVar7[2],puVar7[3]);
    uVar2 = cb->names_found;
    local_70 = cb;
    local_60 = errcodeptr;
    if (uVar2 != 0) {
      str1 = cb->start_pattern + local_78;
      puVar11 = &cb->named_groups->isdup;
      uVar13 = 0;
      do {
        if (uVar15 == puVar11[-1]) {
          iVar3 = _pcre2_strncmp_16(str1,((named_group_16 *)(puVar11 + -7))->name,(ulong)uVar15);
          if (iVar3 == 0) goto LAB_00143e9f;
          uVar2 = local_70->names_found;
        }
        uVar13 = uVar13 + 1;
        puVar11 = puVar11 + 8;
        if (uVar2 <= uVar13) break;
      } while( true );
    }
    goto LAB_00143f06;
  case 4:
switchD_00143b1a_caseD_4:
    local_80 = puVar7 + 1;
  case 0xb:
  case 0x16:
switchD_00143b1a_caseD_b:
    iVar5 = 1;
    break;
  case 5:
    local_80 = puVar7 + 3;
    iVar5 = 0;
    break;
  case 6:
    local_80 = puVar7 + 5;
    break;
  case 7:
    uVar15 = uVar8 & 0xffff;
  case 1:
  case 0x19:
    local_80 = puVar7 + 1;
LAB_00143e63:
    iVar5 = get_grouplength(&local_80,1,errcodeptr,local_58,uVar15,local_68,cb);
    if (iVar5 < 0) {
      return -1;
    }
    break;
  case 8:
  case 0x15:
  case 0x28:
  case 0x2a:
  case 0x2c:
  case 0x2e:
    break;
  case 9:
  case 0xd:
    local_80 = parsed_skip(puVar7,1);
    iVar5 = 1;
    if (local_80 == (uint32_t *)0x0) goto LAB_00143f61;
    break;
  default:
    goto switchD_00143b1a_caseD_a;
  case 0xe:
    local_80 = puVar7 + 1;
    goto LAB_00143b20;
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
    local_80 = puVar7 + 4;
LAB_00143b20:
    uVar15 = 0;
    goto LAB_00143e63;
  case 0x17:
    if ((short)uVar8 == 0x11) {
      return -1;
    }
    uVar8 = uVar8 & 0xffff;
    if (uVar8 == 0x16) {
      return -1;
    }
    if (uVar8 - 6 < 0x11) {
      if ((uVar8 == 0xe) && ((cb->external_options & 0x80000) != 0)) {
        *errcodeptr = 0x88;
        return -1;
      }
      if (uVar8 - 0xf < 2) goto switchD_00143b1a_caseD_4;
      goto switchD_00143b1a_caseD_b;
    }
    break;
  case 0x1a:
    local_80 = puVar7 + 1;
    break;
  case 0x1f:
LAB_00143d51:
    uVar14 = uVar8 & 0xffff;
    local_78 = CONCAT44(puVar7[1],puVar7[2]);
    local_80 = puVar7 + 2;
    goto LAB_00143d6c;
  case 0x21:
  case 0x22:
    local_80 = parsed_skip(puVar7 + 1,2);
    if (local_80 == (uint32_t *)0x0) goto LAB_00143f61;
    uVar8 = local_80[1] << 0x10 | local_80[1] + 0x7fcf0000 >> 0x10;
    if (uVar8 < 9) {
      local_80 = local_80 + 1;
    }
    else if (uVar8 - 9 < 3) {
      local_80 = local_80 + 3;
    }
    break;
  case 0x23:
  case 0x24:
    BVar4 = set_lookbehind_lengths(&local_80,errcodeptr,local_58,local_68,cb);
    if (BVar4 == 0) {
      return -1;
    }
    break;
  case 0x25:
  case 0x29:
  case 0x2b:
  case 0x2d:
  case 0x2f:
    local_80 = puVar7 + (puVar7[1] + 1);
    break;
  case 0x26:
  case 0x27:
    puVar7 = parsed_skip(puVar7,0);
    if (puVar7 == (uint32_t *)0x0) goto LAB_00143f61;
    goto switchD_00143b1a_caseD_0;
  case 0x39:
  case 0x3a:
  case 0x3b:
    uVar14 = puVar7[1];
    if (uVar14 != puVar7[2]) goto switchD_00143b1a_caseD_a;
    local_80 = puVar7 + 2;
    iVar10 = 0;
    if (uVar14 == 0) {
      iVar10 = iVar3;
    }
    iVar5 = (uVar14 - 1) * iVar3;
    if (uVar14 == 0) {
      iVar5 = 0;
    }
    iVar12 = iVar12 - iVar10;
  }
  goto switchD_00143b1a_caseD_8;
LAB_00143e9f:
  uVar14 = *(uint32_t *)(puVar11 + -3);
  if (uVar14 == 0) {
LAB_00143f06:
    *local_60 = 0x73;
    local_70->erroroffset = local_78;
    return -1;
  }
  errcodeptr = local_60;
  cb = local_70;
  if (((uVar8 & 0xffff0000) == 0x80210000) ||
     ((*puVar11 == 0 && ((local_70->external_flags & 0x200000) == 0)))) {
LAB_00143d6c:
    if (cb->bracount < uVar14) {
      cb->erroroffset = local_78;
      *errcodeptr = 0x73;
      return -1;
    }
    if (uVar14 != 0) {
      puVar7 = cb->parsed_pattern;
      uVar9 = *puVar7;
      do {
        if ((uVar9 & 0xffff0000) == 0x80050000) {
          puVar7 = puVar7 + 1;
        }
        else if (uVar9 == (uVar14 | 0x80080000)) goto LAB_00143dc2;
        uVar9 = puVar7[1];
        puVar7 = puVar7 + 1;
      } while( true );
    }
  }
  goto switchD_00143b1a_caseD_a;
switchD_00143b1a_caseD_0:
  *local_48 = puVar7;
  if (cb->max_lookbehind < iVar12) {
    cb->max_lookbehind = iVar12;
    return iVar12;
  }
  return iVar12;
LAB_00143dc2:
  local_50 = puVar7;
  puVar6 = parsed_skip(puVar7 + 1,2);
  if (puVar6 == (uint32_t *)0x0) {
LAB_00143f61:
    *errcodeptr = 0xbe;
    return -1;
  }
  ppVar1 = local_68;
  if (local_80 <= puVar7 || puVar6 <= local_80) {
    for (; ppVar1 != (parsed_recurse_check *)0x0; ppVar1 = ppVar1->prev) {
      if (ppVar1->groupptr == puVar7) goto switchD_00143b1a_caseD_a;
    }
    local_40.prev = local_68;
    local_50 = puVar7 + 1;
    local_40.groupptr = puVar7;
    iVar5 = get_grouplength(&local_50,0,errcodeptr,local_58,uVar14,&local_40,cb);
    if (-1 < iVar5) {
switchD_00143b1a_caseD_8:
      iVar3 = iVar5;
      iVar12 = iVar12 + iVar3;
      if (0xffff < iVar12) {
        *errcodeptr = 0xbb;
        return -1;
      }
      puVar7 = local_80 + 1;
      goto LAB_00143ac6;
    }
    if (*errcodeptr != 0) {
      return -1;
    }
  }
switchD_00143b1a_caseD_a:
  *errcodeptr = 0x7d;
  return -1;
}

Assistant:

static int
get_branchlength(uint32_t **pptrptr, int *errcodeptr, int *lcptr,
  parsed_recurse_check *recurses, compile_block *cb)
{
int branchlength = 0;
int grouplength;
uint32_t lastitemlength = 0;
uint32_t *pptr = *pptrptr;
PCRE2_SIZE offset;
parsed_recurse_check this_recurse;

/* A large and/or complex regex can take too long to process. This can happen
more often when (?| groups are present in the pattern because their length
cannot be cached. */

if ((*lcptr)++ > 2000)
  {
  *errcodeptr = ERR35;  /* Lookbehind is too complicated */
  return -1;
  }

/* Scan the branch, accumulating the length. */

for (;; pptr++)
  {
  parsed_recurse_check *r;
  uint32_t *gptr, *gptrend;
  uint32_t escape;
  uint32_t group = 0;
  uint32_t itemlength = 0;

  if (*pptr < META_END)
    {
    itemlength = 1;
    }

  else switch (META_CODE(*pptr))
    {
    case META_KET:
    case META_ALT:
    goto EXIT;

    /* (*ACCEPT) and (*FAIL) terminate the branch, but we must skip to the
    actual termination. */

    case META_ACCEPT:
    case META_FAIL:
    pptr = parsed_skip(pptr, PSKIP_ALT);
    if (pptr == NULL) goto PARSED_SKIP_FAILED;
    goto EXIT;

    case META_MARK:
    case META_COMMIT_ARG:
    case META_PRUNE_ARG:
    case META_SKIP_ARG:
    case META_THEN_ARG:
    pptr += pptr[1] + 1;
    break;

    case META_CIRCUMFLEX:
    case META_COMMIT:
    case META_DOLLAR:
    case META_PRUNE:
    case META_SKIP:
    case META_THEN:
    break;

    case META_OPTIONS:
    pptr += 1;
    break;

    case META_BIGVALUE:
    itemlength = 1;
    pptr += 1;
    break;

    case META_CLASS:
    case META_CLASS_NOT:
    itemlength = 1;
    pptr = parsed_skip(pptr, PSKIP_CLASS);
    if (pptr == NULL) goto PARSED_SKIP_FAILED;
    break;

    case META_CLASS_EMPTY_NOT:
    case META_DOT:
    itemlength = 1;
    break;

    case META_CALLOUT_NUMBER:
    pptr += 3;
    break;

    case META_CALLOUT_STRING:
    pptr += 3 + SIZEOFFSET;
    break;

    /* Only some escapes consume a character. Of those, \R and \X are never
    allowed because they might match more than character. \C is allowed only in
    32-bit and non-UTF 8/16-bit modes. */

    case META_ESCAPE:
    escape = META_DATA(*pptr);
    if (escape == ESC_R || escape == ESC_X) return -1;
    if (escape > ESC_b && escape < ESC_Z)
      {
#if PCRE2_CODE_UNIT_WIDTH != 32
      if ((cb->external_options & PCRE2_UTF) != 0 && escape == ESC_C)
        {
        *errcodeptr = ERR36;
        return -1;
        }
#endif
      itemlength = 1;
      if (escape == ESC_p || escape == ESC_P) pptr++;  /* Skip prop data */
      }
    break;

    /* Lookaheads can be ignored, but we must start the skip inside the group
    so that it isn't treated as a group within the branch. */

    case META_LOOKAHEAD:
    case META_LOOKAHEADNOT:
    pptr = parsed_skip(pptr + 1, PSKIP_KET);
    if (pptr == NULL) goto PARSED_SKIP_FAILED;

    /* Also ignore any qualifiers that follow a lookahead assertion. */

    switch (pptr[1])
      {
      case META_ASTERISK:
      case META_ASTERISK_PLUS:
      case META_ASTERISK_QUERY:
      case META_PLUS:
      case META_PLUS_PLUS:
      case META_PLUS_QUERY:
      case META_QUERY:
      case META_QUERY_PLUS:
      case META_QUERY_QUERY:
      pptr++;
      break;

      case META_MINMAX:
      case META_MINMAX_PLUS:
      case META_MINMAX_QUERY:
      pptr += 3;
      break;

      default:
      break;
      }
    break;

    /* Lookbehinds can be ignored, but must themselves be checked. */

    case META_LOOKBEHIND:
    case META_LOOKBEHINDNOT:
    if (!set_lookbehind_lengths(&pptr, errcodeptr, lcptr, recurses, cb))
      return -1;
    break;

    /* Back references and recursions are handled by very similar code. At this
    stage, the names generated in the parsing pass are available, but the main
    name table has not yet been created. So for the named varieties, scan the
    list of names in order to get the number of the first one in the pattern,
    and whether or not this name is duplicated. */

    case META_BACKREF_BYNAME:
    if ((cb->external_options & PCRE2_MATCH_UNSET_BACKREF) != 0)
      goto ISNOTFIXED;
    /* Fall through */

    case META_RECURSE_BYNAME:
      {
      int i;
      PCRE2_SPTR name;
      BOOL is_dupname = FALSE;
      named_group *ng = cb->named_groups;
      uint32_t meta_code = META_CODE(*pptr);
      uint32_t length = *(++pptr);

      GETPLUSOFFSET(offset, pptr);
      name = cb->start_pattern + offset;
      for (i = 0; i < cb->names_found; i++, ng++)
        {
        if (length == ng->length && PRIV(strncmp)(name, ng->name, length) == 0)
          {
          group = ng->number;
          is_dupname = ng->isdup;
          break;
          }
        }

      if (group == 0)
        {
        *errcodeptr = ERR15;  /* Non-existent subpattern */
        cb->erroroffset = offset;
        return -1;
        }

      /* A numerical back reference can be fixed length if duplicate capturing
      groups are not being used. A non-duplicate named back reference can also
      be handled. */

      if (meta_code == META_RECURSE_BYNAME ||
          (!is_dupname && (cb->external_flags & PCRE2_DUPCAPUSED) == 0))
        goto RECURSE_OR_BACKREF_LENGTH;  /* Handle as a numbered version. */
      }
    goto ISNOTFIXED;                     /* Duplicate name or number */

    /* The offset values for back references < 10 are in a separate vector
    because otherwise they would use more than two parsed pattern elements on
    64-bit systems. */

    case META_BACKREF:
    if ((cb->external_options & PCRE2_MATCH_UNSET_BACKREF) != 0 ||
        (cb->external_flags & PCRE2_DUPCAPUSED) != 0)
      goto ISNOTFIXED;
    group = META_DATA(*pptr);
    if (group < 10)
      {
      offset = cb->small_ref_offset[group];
      goto RECURSE_OR_BACKREF_LENGTH;
      }

    /* Fall through */
    /* For groups >= 10 - picking up group twice does no harm. */

    /* A true recursion implies not fixed length, but a subroutine call may
    be OK. Back reference "recursions" are also failed. */

    case META_RECURSE:
    group = META_DATA(*pptr);
    GETPLUSOFFSET(offset, pptr);

    RECURSE_OR_BACKREF_LENGTH:
    if (group > cb->bracount)
      {
      cb->erroroffset = offset;
      *errcodeptr = ERR15;  /* Non-existent subpattern */
      return -1;
      }
    if (group == 0) goto ISNOTFIXED;  /* Local recursion */
    for (gptr = cb->parsed_pattern; *gptr != META_END; gptr++)
      {
      if (META_CODE(*gptr) == META_BIGVALUE) gptr++;
        else if (*gptr == (META_CAPTURE | group)) break;
      }

    /* We must start the search for the end of the group at the first meta code
    inside the group. Otherwise it will be treated as an enclosed group. */

    gptrend = parsed_skip(gptr + 1, PSKIP_KET);
    if (gptrend == NULL) goto PARSED_SKIP_FAILED;
    if (pptr > gptr && pptr < gptrend) goto ISNOTFIXED;  /* Local recursion */
    for (r = recurses; r != NULL; r = r->prev) if (r->groupptr == gptr) break;
    if (r != NULL) goto ISNOTFIXED;   /* Mutual recursion */
    this_recurse.prev = recurses;
    this_recurse.groupptr = gptr;

    /* We do not need to know the position of the end of the group, that is,
    gptr is not used after the call to get_grouplength(). Setting the second
    argument FALSE stops it scanning for the end when the length can be found
    in the cache. */

    gptr++;
    grouplength = get_grouplength(&gptr, FALSE, errcodeptr, lcptr, group,
      &this_recurse, cb);
    if (grouplength < 0)
      {
      if (*errcodeptr == 0) goto ISNOTFIXED;
      return -1;  /* Error already set */
      }
    itemlength = grouplength;
    break;

    /* Check nested groups - advance past the initial data for each type and
    then seek a fixed length with get_grouplength(). */

    case META_COND_NAME:
    case META_COND_NUMBER:
    case META_COND_RNAME:
    case META_COND_RNUMBER:
    case META_COND_DEFINE:
    pptr += 2 + SIZEOFFSET;
    goto CHECK_GROUP;

    case META_COND_ASSERT:
    pptr += 1;
    goto CHECK_GROUP;

    case META_COND_VERSION:
    pptr += 4;
    goto CHECK_GROUP;

    case META_CAPTURE:
    group = META_DATA(*pptr);
    /* Fall through */

    case META_ATOMIC:
    case META_NOCAPTURE:
    pptr++;
    CHECK_GROUP:
    grouplength = get_grouplength(&pptr, TRUE, errcodeptr, lcptr, group,
      recurses, cb);
    if (grouplength < 0) return -1;
    itemlength = grouplength;
    break;

    /* Exact repetition is OK; variable repetition is not. A repetition of zero
    must subtract the length that has already been added. */

    case META_MINMAX:
    case META_MINMAX_PLUS:
    case META_MINMAX_QUERY:
    if (pptr[1] == pptr[2])
      {
      if (pptr[1] == 0) branchlength -= lastitemlength;
        else itemlength = (pptr[1] - 1) * lastitemlength;
      pptr += 2;
      break;
      }
    /* Fall through */

    /* Any other item means this branch does not have a fixed length. */

    default:
    ISNOTFIXED:
    *errcodeptr = ERR25;   /* Not fixed length */
    return -1;
    }

  /* Add the item length to the branchlength, and save it for use if the next
  thing is a quantifier. */

  branchlength += itemlength;
  lastitemlength = itemlength;

  /* Ensure that the length does not overflow the limit. */

  if (branchlength > LOOKBEHIND_MAX)
    {
    *errcodeptr = ERR87;
    return -1;
    }
  }

EXIT:
*pptrptr = pptr;
if (branchlength > cb->max_lookbehind) cb->max_lookbehind = branchlength;
return branchlength;

PARSED_SKIP_FAILED:
*errcodeptr = ERR90;
return -1;
}